

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O3

_Bool al_rebase_path(ALLEGRO_PATH *head,ALLEGRO_PATH *tail)

{
  _Bool _Var1;
  char *pcVar2;
  undefined8 *puVar3;
  uint idx;
  ulong uVar4;
  
  _Var1 = path_is_absolute(tail);
  if (!_Var1) {
    pcVar2 = al_cstr(head->drive);
    al_set_path_drive(tail,pcVar2);
    if ((head->segments)._size != 0) {
      uVar4 = 0;
      do {
        idx = (uint)uVar4;
        puVar3 = (undefined8 *)_al_vector_ref(&head->segments,idx);
        pcVar2 = al_cstr((ALLEGRO_USTR *)*puVar3);
        al_insert_path_component(tail,idx,pcVar2);
        uVar4 = (ulong)(idx + 1);
      } while (uVar4 < (head->segments)._size);
    }
  }
  return !_Var1;
}

Assistant:

bool al_rebase_path(const ALLEGRO_PATH *head, ALLEGRO_PATH *tail)
{
   unsigned i;
   ASSERT(head);
   ASSERT(tail);

   /* Don't bother concating if the tail is an absolute path. */
   if (path_is_absolute(tail)) {
      return false;
   }

   al_set_path_drive(tail, al_get_path_drive(head));

   for (i = 0; i < _al_vector_size(&head->segments); i++) {
      al_insert_path_component(tail, i, get_segment_cstr(head, i));
   }

   return true;
}